

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_elements_transaction.cpp
# Opt level: O3

void __thiscall
ElementsTransactionApi_FundRawTransaction_AssetLimitAmountValue_Test::TestBody
          (ElementsTransactionApi_FundRawTransaction_AssetLimitAmountValue_Test *this)

{
  pointer pcVar1;
  pointer puVar2;
  void *pvVar3;
  bool bVar4;
  uint32_t uVar5;
  long lVar6;
  char *pcVar7;
  Amount AVar8;
  initializer_list<cfd::UtxoData> __l;
  ConfidentialTransactionController ctx;
  AssertionResult gtest_ar;
  uint32_t minimum_fee;
  ByteData tx;
  ConfidentialTransactionContext txc;
  ElementsAddressFactory factory;
  UtxoFilter filter;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  append_txout_addresses;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  selected_txin_utxos;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  ConfidentialAssetId fee_asset;
  Amount fee;
  Amount estimate_fee;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  map_target_value;
  CoinSelectionOption option;
  ExtPubkey key;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  reserve_txout_address;
  ElementsConfidentialAddress reserve_ct_addr2;
  ElementsConfidentialAddress reserve_ct_addr4;
  ElementsConfidentialAddress reserve_ct_addr3;
  UtxoData utxo3;
  UtxoData utxo2;
  ElementsConfidentialAddress reserve_ct_addr1;
  UtxoData utxo1;
  Address address4;
  Address address3;
  Address address2;
  Address address1;
  string local_2f08;
  undefined1 local_2ee8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2ee0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2ed8 [4];
  undefined1 local_2e98 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2e90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e88 [12];
  string local_2dc0;
  Pubkey local_2da0;
  ByteData local_2d88;
  undefined1 local_2d70 [40];
  pointer local_2d48;
  pointer local_2d38;
  pointer local_2d30;
  pointer local_2d20;
  pointer local_2d10;
  _Base_ptr local_2d00;
  _Base_ptr local_2cf8;
  pointer local_2ce8;
  AddressFactory local_2c98;
  UtxoFilter local_2c6c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c68;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  local_2c48;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_2c28;
  ConfidentialAssetId local_2c10;
  SigHashType local_2be4;
  SigHashType local_2bd8;
  SigHashType local_2bcc;
  Amount local_2bc0;
  Amount local_2bb0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  local_2ba0;
  CoinSelectionOption local_2b70;
  ExtPubkey local_2b08;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2a78;
  undefined1 local_2a48 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a38 [2];
  pointer local_2a10;
  pointer local_2a08;
  pointer local_29f8;
  pointer local_29e8;
  pointer local_29d8;
  _func_int **local_29d0;
  _func_int **local_29c0;
  pointer local_28c8;
  pointer local_28b8;
  _Alloc_hider local_28b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28a0;
  undefined1 local_2890 [16];
  _Alloc_hider local_2880;
  pointer local_2878;
  undefined8 local_2868;
  pointer local_2858;
  pointer local_2850;
  pointer local_2840;
  pointer local_2830;
  pointer local_2820;
  _func_int **local_2818;
  _func_int **local_2808;
  pointer local_2710;
  pointer local_2700;
  _Alloc_hider local_26f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_26e8;
  undefined1 local_26d8 [16];
  _Alloc_hider local_26c8;
  pointer local_26c0;
  undefined8 local_26b0;
  pointer local_26a0;
  pointer local_2698;
  pointer local_2688;
  pointer local_2678;
  pointer local_2668;
  _func_int **local_2660;
  _func_int **local_2650;
  pointer local_2558;
  pointer local_2548;
  _Alloc_hider local_2540;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2530;
  undefined1 local_2520 [40];
  Txid local_24f8;
  uint32_t local_24d8;
  Script local_24d0 [2];
  Address local_2460;
  undefined1 local_22e0 [8];
  char *local_22d8;
  Amount local_22c0;
  AddressType local_22b0;
  void *local_22a8;
  ConfidentialAssetId local_22a0 [17];
  undefined1 local_1ff8 [40];
  Txid local_1fd0;
  uint32_t local_1fb0;
  Script local_1fa8 [2];
  Address local_1f38;
  undefined1 local_1db8 [8];
  char *local_1db0;
  _func_int **local_1d98;
  bool local_1d90;
  AddressType local_1d88;
  void *local_1d80;
  ConfidentialAssetId local_1d78 [17];
  undefined1 local_1ad0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1ac0 [23];
  pointer local_1950;
  pointer local_1940;
  _Alloc_hider local_1938;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1928 [56];
  UtxoData local_15a8;
  UtxoData local_1080;
  UtxoData local_b58;
  Address local_630;
  Address local_4b0;
  Address local_330;
  Address local_1b0;
  
  cfd::ElementsAddressFactory::ElementsAddressFactory
            ((ElementsAddressFactory *)&local_2c98,kElementsRegtest);
  cfd::UtxoData::UtxoData(&local_b58);
  local_b58.block_height = 0;
  local_b58.binary_data = (void *)0x0;
  pcVar1 = local_1ff8 + 0x10;
  local_1ff8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1ff8,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"
             ,"");
  cfd::core::Txid::Txid((Txid *)local_1ad0,(string *)local_1ff8);
  cfd::core::Txid::operator=(&local_b58.txid,(Txid *)local_1ad0);
  local_1ad0._0_8_ = &PTR__Txid_0086d9f8;
  pvVar3 = (void *)CONCAT71(local_1ad0._9_7_,local_1ad0[8]);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,local_1ac0[0]._8_8_ - (long)pvVar3);
  }
  if ((pointer)local_1ff8._0_8_ != pcVar1) {
    operator_delete((void *)local_1ff8._0_8_,local_1ff8._16_8_ + 1);
  }
  local_b58.vout = 0;
  local_1ff8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1ff8,"76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac","");
  cfd::core::Script::Script((Script *)local_1ad0,(string *)local_1ff8);
  cfd::core::Script::operator=(&local_b58.locking_script,(Script *)local_1ad0);
  cfd::core::Script::~Script((Script *)local_1ad0);
  if ((pointer)local_1ff8._0_8_ != pcVar1) {
    operator_delete((void *)local_1ff8._0_8_,local_1ff8._16_8_ + 1);
  }
  local_1ff8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1ff8,"2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph","");
  cfd::AddressFactory::GetAddress((Address *)local_1ad0,&local_2c98,(string *)local_1ff8);
  cfd::core::Address::operator=(&local_b58.address,(Address *)local_1ad0);
  cfd::core::Address::~Address((Address *)local_1ad0);
  if ((pointer)local_1ff8._0_8_ != pcVar1) {
    operator_delete((void *)local_1ff8._0_8_,local_1ff8._16_8_ + 1);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_b58.descriptor,0,(char *)local_b58.descriptor._M_string_length,0x5b667b);
  cfd::core::Amount::Amount((Amount *)local_1ad0,2000000000000000);
  local_b58.amount.ignore_check_ = local_1ad0[8];
  local_b58.amount.amount_ = local_1ad0._0_8_;
  local_b58.address_type = kP2pkhAddress;
  cfd::core::ConfidentialAssetId::operator=(&local_b58.asset,&exp_dummy_asset_b);
  cfd::UtxoData::UtxoData((UtxoData *)local_1ff8);
  local_1ff8._0_8_ = (pointer)0x0;
  local_1d80 = (void *)0x0;
  pcVar1 = local_2520 + 0x10;
  local_2520._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2520,"31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3"
             ,"");
  cfd::core::Txid::Txid((Txid *)local_1ad0,(string *)local_2520);
  cfd::core::Txid::operator=(&local_1fd0,(Txid *)local_1ad0);
  local_1ad0._0_8_ = &PTR__Txid_0086d9f8;
  pvVar3 = (void *)CONCAT71(local_1ad0._9_7_,local_1ad0[8]);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,local_1ac0[0]._8_8_ - (long)pvVar3);
  }
  if ((pointer)local_2520._0_8_ != pcVar1) {
    operator_delete((void *)local_2520._0_8_,local_2520._16_8_ + 1);
  }
  local_1fb0 = 0;
  local_2520._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2520,"a9145d54db96a28f844a744e393fcd699d6f825b284187","");
  cfd::core::Script::Script((Script *)local_1ad0,(string *)local_2520);
  cfd::core::Script::operator=(local_1fa8,(Script *)local_1ad0);
  cfd::core::Script::~Script((Script *)local_1ad0);
  if ((pointer)local_2520._0_8_ != pcVar1) {
    operator_delete((void *)local_2520._0_8_,local_2520._16_8_ + 1);
  }
  local_2520._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2520,"XKrjM1JtrjasbbrdJ9Ci51dmkZ1DMxzPJE","");
  cfd::AddressFactory::GetAddress((Address *)local_1ad0,&local_2c98,(string *)local_2520);
  cfd::core::Address::operator=(&local_1f38,(Address *)local_1ad0);
  cfd::core::Address::~Address((Address *)local_1ad0);
  if ((pointer)local_2520._0_8_ != pcVar1) {
    operator_delete((void *)local_2520._0_8_,local_2520._16_8_ + 1);
  }
  std::__cxx11::string::_M_replace((ulong)local_1db8,0,local_1db0,0x57b2c5);
  cfd::core::Amount::Amount((Amount *)local_1ad0,2000000000000000);
  local_1d90 = local_1ad0[8];
  local_1d98 = (_func_int **)local_1ad0._0_8_;
  local_1d88 = kP2shP2wpkhAddress;
  cfd::core::ConfidentialAssetId::operator=(local_1d78,&exp_dummy_asset_b);
  cfd::UtxoData::UtxoData((UtxoData *)local_2520);
  local_2520._0_8_ = (pointer)0x0;
  local_22a8 = (void *)0x0;
  local_2a48._0_8_ = local_2a38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2a48,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"
             ,"");
  cfd::core::Txid::Txid((Txid *)local_1ad0,(string *)local_2a48);
  cfd::core::Txid::operator=(&local_24f8,(Txid *)local_1ad0);
  local_1ad0._0_8_ = &PTR__Txid_0086d9f8;
  pvVar3 = (void *)CONCAT71(local_1ad0._9_7_,local_1ad0[8]);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,local_1ac0[0]._8_8_ - (long)pvVar3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a48._0_8_ != local_2a38) {
    operator_delete((void *)local_2a48._0_8_,local_2a38[0]._M_allocated_capacity + 1);
  }
  local_24d8 = 1;
  local_2a48._0_8_ = local_2a38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2a48,"0014f330ed8383f8afdc977dd88600eb8ff120ba15e4","");
  cfd::core::Script::Script((Script *)local_1ad0,(string *)local_2a48);
  cfd::core::Script::operator=(local_24d0,(Script *)local_1ad0);
  cfd::core::Script::~Script((Script *)local_1ad0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a48._0_8_ != local_2a38) {
    operator_delete((void *)local_2a48._0_8_,local_2a38[0]._M_allocated_capacity + 1);
  }
  local_2a48._0_8_ = local_2a38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2a48,"ert1q7vcwmqurlzhae9mamzrqp6u07yst590yvg8j0w","");
  cfd::AddressFactory::GetAddress((Address *)local_1ad0,&local_2c98,(string *)local_2a48);
  cfd::core::Address::operator=(&local_2460,(Address *)local_1ad0);
  cfd::core::Address::~Address((Address *)local_1ad0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a48._0_8_ != local_2a38) {
    operator_delete((void *)local_2a48._0_8_,local_2a38[0]._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_replace((ulong)local_22e0,0,local_22d8,0x5b667a);
  cfd::core::Amount::Amount((Amount *)local_1ad0,50000000000000);
  local_22c0.ignore_check_ = local_1ad0[8];
  local_22c0.amount_ = local_1ad0._0_8_;
  local_22b0 = kP2wpkhAddress;
  cfd::core::ConfidentialAssetId::operator=(local_22a0,&exp_dummy_asset_a);
  local_1ad0._0_8_ = local_1ac0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1ad0,"2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph","");
  cfd::AddressFactory::GetAddress(&local_1b0,&local_2c98,(string *)local_1ad0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ad0._0_8_ != local_1ac0) {
    operator_delete((void *)local_1ad0._0_8_,(ulong)(local_1ac0[0]._M_allocated_capacity + 1));
  }
  local_1ad0._0_8_ = local_1ac0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1ad0,"ert1qg4nrukf07cf4slc0m4h8gq6v2guhzrw2ayudpu","");
  cfd::AddressFactory::GetAddress(&local_330,&local_2c98,(string *)local_1ad0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ad0._0_8_ != local_1ac0) {
    operator_delete((void *)local_1ad0._0_8_,(ulong)(local_1ac0[0]._M_allocated_capacity + 1));
  }
  local_1ad0._0_8_ = local_1ac0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1ad0,"ert1q7vcwmqurlzhae9mamzrqp6u07yst590yvg8j0w","");
  cfd::AddressFactory::GetAddress(&local_4b0,&local_2c98,(string *)local_1ad0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ad0._0_8_ != local_1ac0) {
    operator_delete((void *)local_1ad0._0_8_,(ulong)(local_1ac0[0]._M_allocated_capacity + 1));
  }
  local_1ad0._0_8_ = local_1ac0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1ad0,"ert1qg4nrukf07cf4slc0m4h8gq6v2guhzrw2ayudpu","");
  cfd::AddressFactory::GetAddress(&local_630,&local_2c98,(string *)local_1ad0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ad0._0_8_ != local_1ac0) {
    operator_delete((void *)local_1ad0._0_8_,(ulong)(local_1ac0[0]._M_allocated_capacity + 1));
  }
  local_1ad0._0_8_ = local_1ac0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1ad0,
             "xpub661MyMwAqRbcGB88KaFbLGiYAat55APKhtWg4uYMkXAmfuSTbq2QYsn9sKJCj1YqZPafsboef4h4YbXXhNhPwMbkHTpkf3zLhx7HvFw1NDy"
             ,"");
  cfd::core::ExtPubkey::ExtPubkey(&local_2b08,(string *)local_1ad0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ad0._0_8_ != local_1ac0) {
    operator_delete((void *)local_1ad0._0_8_,(ulong)(local_1ac0[0]._M_allocated_capacity + 1));
  }
  cfd::UtxoData::UtxoData((UtxoData *)local_1ad0,&local_b58);
  cfd::UtxoData::UtxoData(&local_15a8,(UtxoData *)local_1ff8);
  cfd::UtxoData::UtxoData(&local_1080,(UtxoData *)local_2520);
  __l._M_len = 3;
  __l._M_array = (iterator)local_1ad0;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            (&local_2c28,__l,(allocator_type *)local_2a48);
  lVar6 = 0xa50;
  do {
    cfd::UtxoData::~UtxoData((UtxoData *)(local_1ad0 + lVar6));
    lVar6 = lVar6 + -0x528;
  } while (lVar6 != -0x528);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)local_2a48,&local_2b08,0x5b);
  cfd::core::Extkey::GetPubkey((Pubkey *)local_26d8,(Extkey *)local_2a48);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_1ad0,&local_1b0,(ConfidentialKey *)local_26d8);
  if ((pointer)local_26d8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_26d8._0_8_,(long)local_26c8._M_p - local_26d8._0_8_);
  }
  if (local_29d0 != (_func_int **)0x0) {
    operator_delete(local_29d0,(long)local_29c0 - (long)local_29d0);
  }
  if (local_29e8 != (pointer)0x0) {
    operator_delete(local_29e8,(long)local_29d8 - (long)local_29e8);
  }
  if (local_2a08 != (pointer)0x0) {
    operator_delete(local_2a08,(long)local_29f8 - (long)local_2a08);
  }
  if ((pointer)local_2a38[1]._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_2a38[1]._8_8_,(long)local_2a10 - local_2a38[1]._8_8_);
  }
  if ((pointer)local_2a48._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_2a48._8_8_,local_2a38[0]._8_8_ - local_2a48._8_8_);
  }
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)local_26d8,&local_2b08,0x5c);
  cfd::core::Extkey::GetPubkey((Pubkey *)local_2890,(Extkey *)local_26d8);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_2a48,&local_330,(ConfidentialKey *)local_2890);
  if ((pointer)local_2890._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_2890._0_8_,(long)local_2880._M_p - local_2890._0_8_);
  }
  if (local_2660 != (_func_int **)0x0) {
    operator_delete(local_2660,(long)local_2650 - (long)local_2660);
  }
  if (local_2678 != (pointer)0x0) {
    operator_delete(local_2678,(long)local_2668 - (long)local_2678);
  }
  if (local_2698 != (pointer)0x0) {
    operator_delete(local_2698,(long)local_2688 - (long)local_2698);
  }
  if ((pointer)local_26b0 != (pointer)0x0) {
    operator_delete((void *)local_26b0,(long)local_26a0 - local_26b0);
  }
  if ((pointer)local_26d8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_26d8._8_8_,(long)local_26c0 - local_26d8._8_8_);
  }
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)local_2890,&local_2b08,0x5d);
  cfd::core::Extkey::GetPubkey((Pubkey *)local_2d70,(Extkey *)local_2890);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_26d8,&local_4b0,(ConfidentialKey *)local_2d70);
  if ((pointer)local_2d70._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_2d70._0_8_,local_2d70._16_8_ - local_2d70._0_8_);
  }
  if (local_2818 != (_func_int **)0x0) {
    operator_delete(local_2818,(long)local_2808 - (long)local_2818);
  }
  if (local_2830 != (pointer)0x0) {
    operator_delete(local_2830,(long)local_2820 - (long)local_2830);
  }
  if (local_2850 != (pointer)0x0) {
    operator_delete(local_2850,(long)local_2840 - (long)local_2850);
  }
  if ((pointer)local_2868 != (pointer)0x0) {
    operator_delete((void *)local_2868,(long)local_2858 - local_2868);
  }
  if ((pointer)local_2890._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_2890._8_8_,(long)local_2878 - local_2890._8_8_);
  }
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)local_2d70,&local_2b08,0x5e);
  cfd::core::Extkey::GetPubkey((Pubkey *)local_2e98,(Extkey *)local_2d70);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_2890,&local_630,(ConfidentialKey *)local_2e98);
  if (local_2e98 != (undefined1  [8])0x0) {
    operator_delete((void *)local_2e98,local_2e88[0]._M_allocated_capacity - (long)local_2e98);
  }
  if (local_2cf8 != (_Base_ptr)0x0) {
    operator_delete(local_2cf8,(long)local_2ce8 - (long)local_2cf8);
  }
  if (local_2d10 != (pointer)0x0) {
    operator_delete(local_2d10,(long)local_2d00 - (long)local_2d10);
  }
  if (local_2d30 != (pointer)0x0) {
    operator_delete(local_2d30,(long)local_2d20 - (long)local_2d30);
  }
  if (local_2d48 != (pointer)0x0) {
    operator_delete(local_2d48,(long)local_2d38 - (long)local_2d48);
  }
  if ((pointer)local_2d70._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_2d70._8_8_,local_2d70._24_8_ - local_2d70._8_8_);
  }
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_2c10,&exp_dummy_asset_a);
  local_2ba0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2ba0._M_impl.super__Rb_tree_header._M_header;
  local_2ba0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2ba0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2ba0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2ba0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2ba0._M_impl.super__Rb_tree_header._M_header._M_left;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_2d70,&exp_dummy_asset_a);
  cfd::core::Amount::Amount((Amount *)local_2e98);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
  ::_M_emplace_unique<std::__cxx11::string,cfd::core::Amount>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
              *)&local_2ba0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d70,
             (Amount *)local_2e98);
  puVar2 = local_2d70 + 0x10;
  if ((pointer)local_2d70._0_8_ != puVar2) {
    operator_delete((void *)local_2d70._0_8_,(ulong)(local_2d70._16_8_ + 1));
  }
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_2d70,&exp_dummy_asset_b);
  cfd::core::Amount::Amount((Amount *)local_2e98);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
  ::_M_emplace_unique<std::__cxx11::string,cfd::core::Amount>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
              *)&local_2ba0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d70,
             (Amount *)local_2e98);
  if ((pointer)local_2d70._0_8_ != puVar2) {
    operator_delete((void *)local_2d70._0_8_,(ulong)(local_2d70._16_8_ + 1));
  }
  local_2a78._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2a78._M_impl.super__Rb_tree_header._M_header;
  local_2a78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2a78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2a78._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2a78._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2a78._M_impl.super__Rb_tree_header._M_header._M_left;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_2d70,&exp_dummy_asset_a);
  cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_
            ((string *)local_2e98,(ElementsConfidentialAddress *)local_26d8);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::__cxx11::string,std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&local_2a78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d70,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e98);
  if (local_2e98 != (undefined1  [8])local_2e88) {
    operator_delete((void *)local_2e98,(ulong)(local_2e88[0]._M_allocated_capacity + 1));
  }
  if ((pointer)local_2d70._0_8_ != puVar2) {
    operator_delete((void *)local_2d70._0_8_,(ulong)(local_2d70._16_8_ + 1));
  }
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_2d70,&exp_dummy_asset_b);
  cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_
            ((string *)local_2e98,(ElementsConfidentialAddress *)local_2890);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::__cxx11::string,std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&local_2a78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d70,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e98);
  if (local_2e98 != (undefined1  [8])local_2e88) {
    operator_delete((void *)local_2e98,(ulong)(local_2e88[0]._M_allocated_capacity + 1));
  }
  if ((pointer)local_2d70._0_8_ != puVar2) {
    operator_delete((void *)local_2d70._0_8_,(ulong)(local_2d70._16_8_ + 1));
  }
  local_2c48.
  super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c48.
  super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c48.
  super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::core::Amount::Amount(&local_2bb0);
  local_2c68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::CoinSelectionOption::CoinSelectionOption(&local_2b70);
  cfd::CoinSelectionOption::InitializeConfidentialTxSizeInfo(&local_2b70);
  cfd::CoinSelectionOption::SetEffectiveFeeBaserate(&local_2b70,0.11);
  cfd::CoinSelectionOption::SetLongTermFeeBaserate(&local_2b70,0.11);
  cfd::CoinSelectionOption::SetFeeAsset(&local_2b70,&local_2c10);
  cfd::CoinSelectionOption::SetBlindInfo(&local_2b70,0,0x34);
  cfd::core::Amount::Amount(&local_2bc0,10000);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)local_2d70,2,0);
  AVar8 = cfd::core::operator-(&local_22c0,&local_2bc0);
  local_2e98 = (undefined1  [8])AVar8.amount_;
  local_2e90.ptr_._0_1_ = AVar8.ignore_check_;
  cfd::ConfidentialTransactionContext::AddTxOut
            ((ConfidentialTransactionContext *)local_2d70,(ElementsConfidentialAddress *)local_1ad0,
             (Amount *)local_2e98,&exp_dummy_asset_a,false);
  cfd::core::Amount::Amount((Amount *)local_2e98,2100000000000000);
  cfd::ConfidentialTransactionContext::AddTxOut
            ((ConfidentialTransactionContext *)local_2d70,(ElementsConfidentialAddress *)local_2a48,
             (Amount *)local_2e98,&exp_dummy_asset_b,false);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            ((string *)local_2e98,(AbstractTransaction *)local_2d70);
  cfd::api::ElementsTransactionApi::FundRawTransaction
            ((ConfidentialTransactionController *)local_2ee8,(ElementsTransactionApi *)&local_2dc0,
             (string *)local_2e98,&local_2c28,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
              *)&local_2ba0,&local_2c48,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_2a78,&local_2c10,true,0.11,&local_2bb0,&local_2c6c,&local_2b70,&local_2c68,
             kCfdInvalidSettingError,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0,(Amount *)0x0);
  if (local_2e98 != (undefined1  [8])local_2e88) {
    operator_delete((void *)local_2e98,(ulong)(local_2e88[0]._M_allocated_capacity + 1));
  }
  cfd::AbstractTransactionController::GetHex_abi_cxx11_
            (&local_2f08,(AbstractTransactionController *)local_2ee8);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)local_2e98,&local_2f08);
  cfd::ConfidentialTransactionContext::operator=
            ((ConfidentialTransactionContext *)local_2d70,
             (ConfidentialTransactionContext *)local_2e98);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)local_2e98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f08._M_dataplus._M_p != &local_2f08.field_2) {
    operator_delete(local_2f08._M_dataplus._M_p,local_2f08.field_2._M_allocated_capacity + 1);
  }
  local_2ee8 = (undefined1  [8])&PTR__ConfidentialTransactionController_0086d980;
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction
            ((ConfidentialTransaction *)local_2ed8);
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::ConfidentialTransactionContext::CollectInputUtxo
                ((ConfidentialTransactionContext *)local_2d70,&local_2c28);
    }
  }
  else {
    testing::Message::Message((Message *)local_2e98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2ee8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4b9,
               "Expected: txc.CollectInputUtxo(utxos) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2ee8,(Message *)local_2e98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2ee8);
    if (local_2e98 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_2e98 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_2e98 + 8))();
      }
    }
  }
  cfd::core::ByteData::ByteData(&local_2d88);
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_2e98,&local_b58.txid,local_b58.vout);
      local_2ee8 = (undefined1  [8])local_2ed8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2ee8,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b","");
      cfd::core::Pubkey::Pubkey(&local_2da0,(string *)local_2ee8);
      local_2dc0._M_dataplus._M_p = (pointer)&local_2dc0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2dc0,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5","");
      cfd::core::Privkey::FromWif((Privkey *)&local_2f08,&local_2dc0,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_2bcc);
      cfd::ConfidentialTransactionContext::SignWithKey
                ((ConfidentialTransactionContext *)local_2d70,(OutPoint *)local_2e98,&local_2da0,
                 (Privkey *)&local_2f08,&local_2bcc,true,(ByteData256 *)0x0,(ByteData *)0x0);
      if (local_2f08._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_2f08._M_dataplus._M_p,
                        local_2f08.field_2._M_allocated_capacity - (long)local_2f08._M_dataplus._M_p
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2dc0._M_dataplus._M_p != &local_2dc0.field_2) {
        operator_delete(local_2dc0._M_dataplus._M_p,local_2dc0.field_2._M_allocated_capacity + 1);
      }
      if (local_2da0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2da0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2da0.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2da0.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_2ee8 != (undefined1  [8])local_2ed8) {
        operator_delete((void *)local_2ee8,local_2ed8[0]._M_allocated_capacity + 1);
      }
      local_2e98 = (undefined1  [8])&PTR__Txid_0086d9f8;
      pvVar3 = (void *)CONCAT71(local_2e90.ptr_._1_7_,local_2e90.ptr_._0_1_);
      if (pvVar3 != (void *)0x0) {
        operator_delete(pvVar3,local_2e88[0]._8_8_ - (long)pvVar3);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_2e98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2ee8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4c0,
               "Expected: txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2ee8,(Message *)local_2e98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2ee8);
    if (local_2e98 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_2e98 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_2e98 + 8))();
      }
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_2e98,&local_b58.txid,local_b58.vout);
      cfd::ConfidentialTransactionContext::Verify
                ((ConfidentialTransactionContext *)local_2d70,(OutPoint *)local_2e98);
      local_2e98 = (undefined1  [8])&PTR__Txid_0086d9f8;
      pvVar3 = (void *)CONCAT71(local_2e90.ptr_._1_7_,local_2e90.ptr_._0_1_);
      if (pvVar3 != (void *)0x0) {
        operator_delete(pvVar3,local_2e88[0]._8_8_ - (long)pvVar3);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_2e98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2ee8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4c1,
               "Expected: txc.Verify(OutPoint(utxo1.txid, utxo1.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2ee8,(Message *)local_2e98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2ee8);
    if (local_2e98 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_2e98 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_2e98 + 8))();
      }
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    cfd::ConfidentialTransactionContext::Finalize
              ((ByteData *)local_2e98,(ConfidentialTransactionContext *)local_2d70);
    cfd::core::ByteData::operator=(&local_2d88,(ByteData *)local_2e98);
    if (local_2e98 != (undefined1  [8])0x0) {
      operator_delete((void *)local_2e98,local_2e88[0]._M_allocated_capacity - (long)local_2e98);
    }
  }
  testing::Message::Message((Message *)local_2e98);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_2ee8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
             ,0x4c2,
             "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)local_2ee8,(Message *)local_2e98);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2ee8);
  if (local_2e98 != (undefined1  [8])0x0) {
    bVar4 = testing::internal::IsTrue(true);
    if ((bVar4) && (local_2e98 != (undefined1  [8])0x0)) {
      (**(code **)(*(size_type *)local_2e98 + 8))();
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_2e98,&local_1fd0,local_1fb0);
      local_2ee8 = (undefined1  [8])local_2ed8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2ee8,
                 "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27","");
      cfd::core::Pubkey::Pubkey(&local_2da0,(string *)local_2ee8);
      local_2dc0._M_dataplus._M_p = (pointer)&local_2dc0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2dc0,"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP","");
      cfd::core::Privkey::FromWif((Privkey *)&local_2f08,&local_2dc0,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_2bd8);
      cfd::ConfidentialTransactionContext::SignWithKey
                ((ConfidentialTransactionContext *)local_2d70,(OutPoint *)local_2e98,&local_2da0,
                 (Privkey *)&local_2f08,&local_2bd8,true,(ByteData256 *)0x0,(ByteData *)0x0);
      if (local_2f08._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_2f08._M_dataplus._M_p,
                        local_2f08.field_2._M_allocated_capacity - (long)local_2f08._M_dataplus._M_p
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2dc0._M_dataplus._M_p != &local_2dc0.field_2) {
        operator_delete(local_2dc0._M_dataplus._M_p,local_2dc0.field_2._M_allocated_capacity + 1);
      }
      if (local_2da0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2da0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2da0.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2da0.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_2ee8 != (undefined1  [8])local_2ed8) {
        operator_delete((void *)local_2ee8,local_2ed8[0]._M_allocated_capacity + 1);
      }
      local_2e98 = (undefined1  [8])&PTR__Txid_0086d9f8;
      pvVar3 = (void *)CONCAT71(local_2e90.ptr_._1_7_,local_2e90.ptr_._0_1_);
      if (pvVar3 != (void *)0x0) {
        operator_delete(pvVar3,local_2e88[0]._8_8_ - (long)pvVar3);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_2e98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2ee8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4c7,
               "Expected: txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout), Pubkey(\"0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27\"), Privkey::FromWif( \"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2ee8,(Message *)local_2e98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2ee8);
    if (local_2e98 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_2e98 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_2e98 + 8))();
      }
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_2e98,&local_1fd0,local_1fb0);
      cfd::ConfidentialTransactionContext::Verify
                ((ConfidentialTransactionContext *)local_2d70,(OutPoint *)local_2e98);
      local_2e98 = (undefined1  [8])&PTR__Txid_0086d9f8;
      pvVar3 = (void *)CONCAT71(local_2e90.ptr_._1_7_,local_2e90.ptr_._0_1_);
      if (pvVar3 != (void *)0x0) {
        operator_delete(pvVar3,local_2e88[0]._8_8_ - (long)pvVar3);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_2e98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2ee8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4c8,
               "Expected: txc.Verify(OutPoint(utxo2.txid, utxo2.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2ee8,(Message *)local_2e98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2ee8);
    if (local_2e98 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_2e98 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_2e98 + 8))();
      }
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    cfd::ConfidentialTransactionContext::Finalize
              ((ByteData *)local_2e98,(ConfidentialTransactionContext *)local_2d70);
    cfd::core::ByteData::operator=(&local_2d88,(ByteData *)local_2e98);
    if (local_2e98 != (undefined1  [8])0x0) {
      operator_delete((void *)local_2e98,local_2e88[0]._M_allocated_capacity - (long)local_2e98);
    }
  }
  testing::Message::Message((Message *)local_2e98);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_2ee8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
             ,0x4c9,
             "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)local_2ee8,(Message *)local_2e98);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2ee8);
  if (local_2e98 != (undefined1  [8])0x0) {
    bVar4 = testing::internal::IsTrue(true);
    if ((bVar4) && (local_2e98 != (undefined1  [8])0x0)) {
      (**(code **)(*(size_type *)local_2e98 + 8))();
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_2e98,&local_24f8,local_24d8);
      local_2ee8 = (undefined1  [8])local_2ed8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2ee8,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b","");
      cfd::core::Pubkey::Pubkey(&local_2da0,(string *)local_2ee8);
      local_2dc0._M_dataplus._M_p = (pointer)&local_2dc0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2dc0,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5","");
      cfd::core::Privkey::FromWif((Privkey *)&local_2f08,&local_2dc0,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_2be4);
      cfd::ConfidentialTransactionContext::SignWithKey
                ((ConfidentialTransactionContext *)local_2d70,(OutPoint *)local_2e98,&local_2da0,
                 (Privkey *)&local_2f08,&local_2be4,true,(ByteData256 *)0x0,(ByteData *)0x0);
      if (local_2f08._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_2f08._M_dataplus._M_p,
                        local_2f08.field_2._M_allocated_capacity - (long)local_2f08._M_dataplus._M_p
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2dc0._M_dataplus._M_p != &local_2dc0.field_2) {
        operator_delete(local_2dc0._M_dataplus._M_p,local_2dc0.field_2._M_allocated_capacity + 1);
      }
      if (local_2da0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2da0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2da0.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2da0.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_2ee8 != (undefined1  [8])local_2ed8) {
        operator_delete((void *)local_2ee8,local_2ed8[0]._M_allocated_capacity + 1);
      }
      local_2e98 = (undefined1  [8])&PTR__Txid_0086d9f8;
      pvVar3 = (void *)CONCAT71(local_2e90.ptr_._1_7_,local_2e90.ptr_._0_1_);
      if (pvVar3 != (void *)0x0) {
        operator_delete(pvVar3,local_2e88[0]._8_8_ - (long)pvVar3);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_2e98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2ee8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4ce,
               "Expected: txc.SignWithKey(OutPoint(utxo3.txid, utxo3.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2ee8,(Message *)local_2e98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2ee8);
    if (local_2e98 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_2e98 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_2e98 + 8))();
      }
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_2e98,&local_24f8,local_24d8);
      cfd::ConfidentialTransactionContext::Verify
                ((ConfidentialTransactionContext *)local_2d70,(OutPoint *)local_2e98);
      local_2e98 = (undefined1  [8])&PTR__Txid_0086d9f8;
      pvVar3 = (void *)CONCAT71(local_2e90.ptr_._1_7_,local_2e90.ptr_._0_1_);
      if (pvVar3 != (void *)0x0) {
        operator_delete(pvVar3,local_2e88[0]._8_8_ - (long)pvVar3);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_2e98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2ee8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4cf,
               "Expected: txc.Verify(OutPoint(utxo3.txid, utxo3.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2ee8,(Message *)local_2e98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2ee8);
    if (local_2e98 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_2e98 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_2e98 + 8))();
      }
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::ConfidentialTransactionContext::Finalize
                ((ByteData *)local_2e98,(ConfidentialTransactionContext *)local_2d70);
      cfd::core::ByteData::operator=(&local_2d88,(ByteData *)local_2e98);
      if (local_2e98 != (undefined1  [8])0x0) {
        operator_delete((void *)local_2e98,local_2e88[0]._M_allocated_capacity - (long)local_2e98);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_2e98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2ee8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4d1,
               "Expected: tx = txc.Finalize() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2ee8,(Message *)local_2e98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2ee8);
    if (local_2e98 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_2e98 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_2e98 + 8))();
      }
    }
  }
  AVar8 = cfd::ConfidentialTransactionContext::GetFeeAmount
                    ((ConfidentialTransactionContext *)local_2d70,(ConfidentialAssetId *)0x0);
  local_2ee8 = (undefined1  [8])AVar8.amount_;
  local_2ee0.ptr_._0_1_ = AVar8.ignore_check_;
  local_2f08._M_dataplus._M_p = (pointer)cfd::core::Amount::GetSatoshiValue((Amount *)local_2ee8);
  local_2dc0._M_dataplus._M_p = (pointer)cfd::core::Amount::GetSatoshiValue(&local_2bb0);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_2e98,"txc.GetFeeAmount().GetSatoshiValue()",
             "estimate_fee.GetSatoshiValue()",(long *)&local_2f08,(long *)&local_2dc0);
  if (local_2e98[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2ee8);
    if ((undefined8 *)CONCAT71(local_2e90.ptr_._1_7_,local_2e90.ptr_._0_1_) == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)CONCAT71(local_2e90.ptr_._1_7_,local_2e90.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2f08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4d2,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2f08,(Message *)local_2ee8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2f08);
    if (local_2ee8 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_2ee8 != (undefined1  [8])0x0)) {
        (**(code **)(*(_func_int **)local_2ee8 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2e90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_2e98,&local_2d88);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_2ee8,"tx.GetHex().c_str()",
             "\"020000000103a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402200ab5855d6f2aacba3c02bf7e7d7feb5ac07f0dd1081f645b26d7c3761a6586dc02206ade8c8d928f3deefa3ca205b25fa6368a4cf90277196f24a2be3c21b867f78101210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffff050100000000000000000000000000000000000000000000000000000000000000aa0100002d79883cf8f00308f34c0c7de1a49ec53acb73aeb94306a90987759c2c012492e877a0dde821d91976a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac0100000000000000000000000000000000000000000000000000000000000000bb01000775f05a07400002761f92316d668b7ad54ea7da8f4bfd1b266d677e9786b98274f647cc74ae306e16001445663e592ff613587f0fdd6e74034c5239710dca0100000000000000000000000000000000000000000000000000000000000000aa01000000000000023900000100000000000000000000000000000000000000000000000000000000000000bb010006c00a3912c000033b8298639bbce61dddf46d9d9d257e6ab497314075555f2029c5b9ab4a3ad9c716001445663e592ff613587f0fdd6e74034c5239710dca0100000000000000000000000000000000000000000000000000000000000000aa0100000000000024d7029e1f4cd73bb6d29257ca37a3882cd09661783c90cdd92b57264a13bdab822905160014f330ed8383f8afdc977dd88600eb8ff120ba15e400000000000002473044022003c51f2fb5cd560550759c1652ca962a6644e54bfef8adf675d1e3e3791b7a5d02204640a7d3abbc4e31668b59178b35b2cb0bad8abe5f1dfb474db3d40295e07db301210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b0000000000000002473044022033cf5cb157f8932d77683fd55ee70b21fc41b715f0f82d746dbc254e1c114ec60220355b6c0170c55da3b7d4c2c6b5fbd62da8a839c18798f06b7c29e39808b1ec5601210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a270000000000000000000000\""
             ,(char *)local_2e98,
             "020000000103a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402200ab5855d6f2aacba3c02bf7e7d7feb5ac07f0dd1081f645b26d7c3761a6586dc02206ade8c8d928f3deefa3ca205b25fa6368a4cf90277196f24a2be3c21b867f78101210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffff050100000000000000000000000000000000000000000000000000000000000000aa0100002d79883cf8f00308f34c0c7de1a49ec53acb73aeb94306a90987759c2c012492e877a0dde821d91976a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac0100000000000000000000000000000000000000000000000000000000000000bb01000775f05a07400002761f92316d668b7ad54ea7da8f4bfd1b266d677e9786b98274f647cc74ae306e16001445663e592ff613587f0fdd6e74034c5239710dca0100000000000000000000000000000000000000000000000000000000000000aa01000000000000023900000100000000000000000000000000000000000000000000000000000000000000bb010006c00a3912c000033b8298639bbce61dddf46d9d9d257e6ab497314075555f2029c5b9ab4a3ad9c716001445663e592ff613587f0fdd6e74034c5239710dca0100000000000000000000000000000000000000000000000000000000000000aa0100000000000024d7029e1f4cd73bb6d29257ca37a3882cd09661783c90cdd92b57264a13bdab822905160014f330ed8383f8afdc977dd88600eb8ff120ba15e400000000000002473044022003c51f2fb5cd560550759c1652ca962a6644e54bfef8adf675d1e3e3791b7a5d02204640a7d3abbc4e31668b59178b35b2cb0bad8abe5f1dfb474db3d40295e07db301210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b0000000000000002473044022033cf5cb157f8932d77683fd55ee70b21fc41b715f0f82d746dbc254e1c114ec60220355b6c0170c55da3b7d4c2c6b5fbd62da8a839c18798f06b7c29e39808b1ec5601210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a270000000000000000000000"
            );
  if (local_2e98 != (undefined1  [8])local_2e88) {
    operator_delete((void *)local_2e98,(ulong)(local_2e88[0]._M_allocated_capacity + 1));
  }
  if (local_2ee8[0] == (string)0x0) {
    testing::Message::Message((Message *)local_2e98);
    if ((undefined8 *)CONCAT71(local_2ee0.ptr_._1_7_,local_2ee0.ptr_._0_1_) == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)CONCAT71(local_2ee0.ptr_._1_7_,local_2ee0.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2f08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4d3,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2f08,(Message *)local_2e98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2f08);
    if (local_2e98 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_2e98 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_2e98 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2ee0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar5 = cfd::core::ConfidentialTransaction::GetVsize((ConfidentialTransaction *)local_2d70);
  local_2ee8._0_4_ = uVar5;
  local_2f08._M_dataplus._M_p._0_4_ = 0x2f9;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_2e98,"txc.GetVsize()","761",(uint *)local_2ee8,(int *)&local_2f08);
  if (local_2e98[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2ee8);
    if ((undefined8 *)CONCAT71(local_2e90.ptr_._1_7_,local_2e90.ptr_._0_1_) == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)CONCAT71(local_2e90.ptr_._1_7_,local_2e90.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2f08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4d4,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2f08,(Message *)local_2ee8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2f08);
    if (local_2ee8 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_2ee8 != (undefined1  [8])0x0)) {
        (**(code **)(*(_func_int **)local_2ee8 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2e90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar5 = cfd::core::ConfidentialTransaction::GetVsize((ConfidentialTransaction *)local_2d70);
  local_2dc0._M_dataplus._M_p._0_4_ = (uVar5 * 0xb) / 100;
  local_2ee8._0_4_ = 0x53;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_2e98,"minimum_fee","83",(uint *)&local_2dc0,(int *)local_2ee8);
  if (local_2e98[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2ee8);
    if ((undefined8 *)CONCAT71(local_2e90.ptr_._1_7_,local_2e90.ptr_._0_1_) == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)CONCAT71(local_2e90.ptr_._1_7_,local_2e90.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2f08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4d7,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2f08,(Message *)local_2ee8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2f08);
    if (local_2ee8 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_2ee8 != (undefined1  [8])0x0)) {
        (**(code **)(*(_func_int **)local_2ee8 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2e90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_2d88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2d88.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2d88.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2d88.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)local_2d70);
  local_2b70.fee_asset_._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_0086dd08
  ;
  if (local_2b70.fee_asset_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b70.fee_asset_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2b70.fee_asset_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b70.fee_asset_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2c68);
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  ~vector(&local_2c48);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_2a78);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  ::~_Rb_tree(&local_2ba0);
  local_2c10._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_0086dd08;
  if (local_2c10.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2c10.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2c10.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2c10.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_26f8._M_p != &local_26e8) {
    operator_delete(local_26f8._M_p,local_26e8._M_allocated_capacity + 1);
  }
  if (local_2710 != (pointer)0x0) {
    operator_delete(local_2710,(long)local_2700 - (long)local_2710);
  }
  cfd::core::Address::~Address((Address *)local_2890);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2540._M_p != &local_2530) {
    operator_delete(local_2540._M_p,local_2530._M_allocated_capacity + 1);
  }
  if (local_2558 != (pointer)0x0) {
    operator_delete(local_2558,(long)local_2548 - (long)local_2558);
  }
  cfd::core::Address::~Address((Address *)local_26d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28b0._M_p != &local_28a0) {
    operator_delete(local_28b0._M_p,local_28a0._M_allocated_capacity + 1);
  }
  if (local_28c8 != (pointer)0x0) {
    operator_delete(local_28c8,(long)local_28b8 - (long)local_28c8);
  }
  cfd::core::Address::~Address((Address *)local_2a48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1938._M_p != local_1928) {
    operator_delete(local_1938._M_p,(ulong)(local_1928[0]._M_allocated_capacity + 1));
  }
  if (local_1950 != (pointer)0x0) {
    operator_delete(local_1950,(long)local_1940 - (long)local_1950);
  }
  cfd::core::Address::~Address((Address *)local_1ad0);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&local_2c28);
  if (local_2b08.super_Extkey.tweak_sum_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b08.super_Extkey.tweak_sum_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2b08.super_Extkey.tweak_sum_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b08.super_Extkey.tweak_sum_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2b08.super_Extkey.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b08.super_Extkey.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2b08.super_Extkey.pubkey_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b08.super_Extkey.pubkey_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2b08.super_Extkey.privkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b08.super_Extkey.privkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2b08.super_Extkey.privkey_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b08.super_Extkey.privkey_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2b08.super_Extkey.chaincode_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b08.super_Extkey.chaincode_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2b08.super_Extkey.chaincode_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b08.super_Extkey.chaincode_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2b08.super_Extkey.fingerprint_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b08.super_Extkey.fingerprint_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2b08.super_Extkey.fingerprint_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b08.super_Extkey.fingerprint_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  cfd::core::Address::~Address(&local_630);
  cfd::core::Address::~Address(&local_4b0);
  cfd::core::Address::~Address(&local_330);
  cfd::core::Address::~Address(&local_1b0);
  cfd::UtxoData::~UtxoData((UtxoData *)local_2520);
  cfd::UtxoData::~UtxoData((UtxoData *)local_1ff8);
  cfd::UtxoData::~UtxoData(&local_b58);
  local_2c98._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_0086bad8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_2c98.prefix_list_);
  return;
}

Assistant:

TEST(ElementsTransactionApi, FundRawTransaction_AssetLimitAmountValue) {
  ElementsAddressFactory factory(NetType::kElementsRegtest);
  // Address1
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo1.vout = 0;
  utxo1.locking_script = Script("76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac");
  // utxo1.redeem_script = Script("");
  utxo1.address = factory.GetAddress("2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph");
  utxo1.descriptor = "pkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo1.amount = Amount(int64_t{2000000000000000});
  utxo1.address_type = AddressType::kP2pkhAddress;
  utxo1.asset = exp_dummy_asset_b;

  // Address2 (pattern-x1)
  // pubkey: '0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27',
  // privkey: 'cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP'
  UtxoData utxo2;
  utxo2.block_height = 0;
  utxo2.binary_data = nullptr;
  utxo2.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo2.vout = 0;
  utxo2.locking_script = Script("a9145d54db96a28f844a744e393fcd699d6f825b284187");
  // utxo1.redeem_script = Script("");
  utxo2.address = factory.GetAddress("XKrjM1JtrjasbbrdJ9Ci51dmkZ1DMxzPJE");
  utxo2.descriptor = "sh(wpkh(0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27))";
  utxo2.amount = Amount(int64_t{2000000000000000});
  utxo2.address_type = AddressType::kP2shP2wpkhAddress;
  utxo2.asset = exp_dummy_asset_b;

  // Address3
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo3;
  utxo3.block_height = 0;
  utxo3.binary_data = nullptr;
  utxo3.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo3.vout = 1;
  utxo3.locking_script = Script("0014f330ed8383f8afdc977dd88600eb8ff120ba15e4");
  // utxo1.redeem_script = Script("");
  utxo3.address = factory.GetAddress("ert1q7vcwmqurlzhae9mamzrqp6u07yst590yvg8j0w");
  utxo3.descriptor = "wpkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo3.amount = Amount(int64_t{50000000000000});
  utxo3.address_type = AddressType::kP2wpkhAddress;
  utxo3.asset = exp_dummy_asset_a;

  // "2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6";
  Address address1 = factory.GetAddress("2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph");
  // "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"
  Address address2 = factory.GetAddress("ert1qg4nrukf07cf4slc0m4h8gq6v2guhzrw2ayudpu");
  Address address3 = factory.GetAddress("ert1q7vcwmqurlzhae9mamzrqp6u07yst590yvg8j0w");
  Address address4 = factory.GetAddress("ert1qg4nrukf07cf4slc0m4h8gq6v2guhzrw2ayudpu");

  ExtPubkey key = ExtPubkey("xpub661MyMwAqRbcGB88KaFbLGiYAat55APKhtWg4uYMkXAmfuSTbq2QYsn9sKJCj1YqZPafsboef4h4YbXXhNhPwMbkHTpkf3zLhx7HvFw1NDy");

  std::vector<cfd::UtxoData> utxos{utxo1, utxo2, utxo3};

  ElementsConfidentialAddress reserve_ct_addr1 = ElementsConfidentialAddress(
      address1, key.DerivePubkey(91).GetPubkey());
  ElementsConfidentialAddress reserve_ct_addr2 = ElementsConfidentialAddress(
      address2, key.DerivePubkey(92).GetPubkey());
  ElementsConfidentialAddress reserve_ct_addr3 = ElementsConfidentialAddress(
      address3, key.DerivePubkey(93).GetPubkey());
  ElementsConfidentialAddress reserve_ct_addr4 = ElementsConfidentialAddress(
      address4, key.DerivePubkey(94).GetPubkey());

  double fee_rate = 0.11;
  ConfidentialAssetId fee_asset = exp_dummy_asset_a;
  std::map<std::string, Amount> map_target_value;
  map_target_value.emplace(exp_dummy_asset_a.GetHex(), Amount());
  map_target_value.emplace(exp_dummy_asset_b.GetHex(), Amount());
  std::map<std::string, std::string> reserve_txout_address;
  reserve_txout_address.emplace(exp_dummy_asset_a.GetHex(), reserve_ct_addr3.GetAddress());
  reserve_txout_address.emplace(exp_dummy_asset_b.GetHex(), reserve_ct_addr4.GetAddress());
  std::vector<ElementsUtxoAndOption> selected_txin_utxos;
  Amount estimate_fee;
  UtxoFilter filter;
  std::vector<std::string> append_txout_addresses;
  CoinSelectionOption option;
  option.InitializeConfidentialTxSizeInfo();
  option.SetEffectiveFeeBaserate(fee_rate);
  option.SetLongTermFeeBaserate(fee_rate);
  option.SetFeeAsset(fee_asset);
  option.SetBlindInfo(0, 52);

  Amount fee(int64_t{10000});
  ConfidentialTransactionContext txc(2, 0);
  txc.AddTxOut(reserve_ct_addr1, utxo3.amount - fee, exp_dummy_asset_a);
  txc.AddTxOut(reserve_ct_addr2, Amount(int64_t{2100000000000000}), exp_dummy_asset_b);

  try {
    ElementsTransactionApi api;
    ConfidentialTransactionController ctx = api.FundRawTransaction(
        txc.GetHex(), utxos, map_target_value, selected_txin_utxos,
        reserve_txout_address, fee_asset, true, fee_rate, &estimate_fee,
        &filter, &option, &append_txout_addresses, NetType::kElementsRegtest);
    txc = ConfidentialTransactionContext(ctx.GetHex());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  EXPECT_NO_THROW(txc.CollectInputUtxo(utxos));

  ByteData tx;

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo1.txid, utxo1.vout)));
  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout),
      Pubkey("0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"),
      Privkey::FromWif(
          "cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo2.txid, utxo2.vout)));
  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo3.txid, utxo3.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo3.txid, utxo3.vout)));

  EXPECT_NO_THROW(tx = txc.Finalize());
  EXPECT_EQ(txc.GetFeeAmount().GetSatoshiValue(), estimate_fee.GetSatoshiValue());
  EXPECT_STREQ(tx.GetHex().c_str(), "020000000103a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402200ab5855d6f2aacba3c02bf7e7d7feb5ac07f0dd1081f645b26d7c3761a6586dc02206ade8c8d928f3deefa3ca205b25fa6368a4cf90277196f24a2be3c21b867f78101210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffff050100000000000000000000000000000000000000000000000000000000000000aa0100002d79883cf8f00308f34c0c7de1a49ec53acb73aeb94306a90987759c2c012492e877a0dde821d91976a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac0100000000000000000000000000000000000000000000000000000000000000bb01000775f05a07400002761f92316d668b7ad54ea7da8f4bfd1b266d677e9786b98274f647cc74ae306e16001445663e592ff613587f0fdd6e74034c5239710dca0100000000000000000000000000000000000000000000000000000000000000aa01000000000000023900000100000000000000000000000000000000000000000000000000000000000000bb010006c00a3912c000033b8298639bbce61dddf46d9d9d257e6ab497314075555f2029c5b9ab4a3ad9c716001445663e592ff613587f0fdd6e74034c5239710dca0100000000000000000000000000000000000000000000000000000000000000aa0100000000000024d7029e1f4cd73bb6d29257ca37a3882cd09661783c90cdd92b57264a13bdab822905160014f330ed8383f8afdc977dd88600eb8ff120ba15e400000000000002473044022003c51f2fb5cd560550759c1652ca962a6644e54bfef8adf675d1e3e3791b7a5d02204640a7d3abbc4e31668b59178b35b2cb0bad8abe5f1dfb474db3d40295e07db301210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b0000000000000002473044022033cf5cb157f8932d77683fd55ee70b21fc41b715f0f82d746dbc254e1c114ec60220355b6c0170c55da3b7d4c2c6b5fbd62da8a839c18798f06b7c29e39808b1ec5601210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a270000000000000000000000");
  EXPECT_EQ(txc.GetVsize(), 761);

  uint32_t minimum_fee = txc.GetVsize() * static_cast<uint32_t>(fee_rate * 100) / 100;
  EXPECT_EQ(minimum_fee, 83);
}